

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_chunk.c
# Opt level: O0

nng_err nni_http_chunks_parse(nni_http_chunks *cl,void *buf,size_t n,size_t *lenp)

{
  nng_err nVar1;
  size_t local_50;
  size_t cnt;
  void *pvStack_40;
  int rv;
  char *src;
  size_t i;
  size_t *lenp_local;
  size_t n_local;
  void *buf_local;
  nni_http_chunks *cl_local;
  
  src = (char *)0x0;
  pvStack_40 = buf;
  i = (size_t)lenp;
  lenp_local = (size_t *)n;
  n_local = (size_t)buf;
  buf_local = cl;
  while( true ) {
    do {
      while( true ) {
        if (*(int *)((long)buf_local + 0x30) == 7 || lenp_local <= src) {
          *(char **)i = src;
          if (*(int *)((long)buf_local + 0x30) == 7) {
            cl_local._4_4_ = NNG_OK;
          }
          else {
            cl_local._4_4_ = NNG_EAGAIN;
          }
          return cl_local._4_4_;
        }
        if (*(int *)((long)buf_local + 0x30) != 4) break;
        nVar1 = chunk_ingest_data((nni_http_chunks *)buf_local,
                                  (char *)((long)pvStack_40 + (long)src),
                                  (long)lenp_local - (long)src,&local_50);
        if (nVar1 != NNG_OK) {
          return nVar1;
        }
        src = src + local_50;
        cnt._4_4_ = 0;
      }
    } while (*(int *)((long)buf_local + 0x30) == 7);
    nVar1 = chunk_ingest_char((nni_http_chunks *)buf_local,*(char *)((long)pvStack_40 + (long)src));
    if (nVar1 != NNG_OK) break;
    src = src + 1;
    cnt._4_4_ = 0;
  }
  return nVar1;
}

Assistant:

nng_err
nni_http_chunks_parse(nni_http_chunks *cl, void *buf, size_t n, size_t *lenp)
{
	size_t i   = 0;
	char  *src = buf;

	// Format of this data is <hexdigits> [ ; <ascii> CRLF ]
	// The <ascii> are chunk extensions, and we don't support any.

	while ((cl->cl_state != CS_DONE) && (i < n)) {
		int    rv;
		size_t cnt;
		switch (cl->cl_state) {
		case CS_DONE:
			// Completed parse!
			break;

		case CS_DATA:
			if ((rv = chunk_ingest_data(
			         cl, src + i, n - i, &cnt)) != 0) {
				return (rv);
			}
			i += cnt;
			break;

		default:
			// All others character by character parse through
			// the state machine grinder.
			if ((rv = chunk_ingest_char(cl, src[i])) != 0) {
				return (rv);
			}
			i++;
			break;
		}
	}

	*lenp = i;
	if (cl->cl_state != CS_DONE) {
		return (NNG_EAGAIN);
	}
	return (NNG_OK);
}